

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void destroyBindings(BINDING *bindings,XML_Parser parser)

{
  binding *pbVar1;
  
  while (bindings != (BINDING *)0x0) {
    pbVar1 = bindings->nextTagBinding;
    (*(parser->m_mem).free_fcn)(bindings->uri);
    (*(parser->m_mem).free_fcn)(bindings);
    bindings = pbVar1;
  }
  return;
}

Assistant:

static void FASTCALL
destroyBindings(BINDING *bindings, XML_Parser parser) {
  for (;;) {
    BINDING *b = bindings;
    if (! b)
      break;
    bindings = b->nextTagBinding;
    FREE(parser, b->uri);
    FREE(parser, b);
  }
}